

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphGenerator.cpp
# Opt level: O2

void __thiscall GraphGenerator::Generate(GraphGenerator *this,int n,double density,double eps)

{
  pointer ppVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  GraphGenerator *this_00;
  pair<int,_int> pVar5;
  pair<int,_int> pVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  pair<int,_int> local_38;
  
  ppVar1 = (this->edges).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->edges).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (this->edges).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  lVar10 = (long)(1.0 / eps);
  uVar2 = (ulong)(density / eps);
  uVar9 = 0;
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  pVar6.first = 0;
  pVar6.second = 1;
  iVar8 = 1;
  this_00 = this;
  while( true ) {
    pVar5 = pVar6;
    iVar7 = iVar8;
    if (uVar9 == uVar4) break;
    for (; iVar7 < n; iVar7 = iVar7 + 1) {
      sVar3 = randRange(this_00,0,
                        (uint)lVar10 |
                        (uint)(long)(1.0 / eps - 9.223372036854776e+18) & (uint)(lVar10 >> 0x3f));
      if (sVar3 < ((long)(density / eps - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2)) {
        this_00 = (GraphGenerator *)&this->edges;
        local_38 = pVar5;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->edges,
                   &local_38);
      }
      pVar5 = (pair<int,_int>)((long)pVar5 + 0x100000000);
    }
    uVar9 = uVar9 + 1;
    pVar6 = (pair<int,_int>)((long)pVar6 + 0x100000001);
    iVar8 = iVar8 + 1;
  }
  (**this->_vptr_GraphGenerator)(this,n);
  return;
}

Assistant:

void GraphGenerator::Generate(int n, double density, double eps) {
	edges.clear();
	size_t tot = 1 / eps;
	size_t den = density / eps;
	for (int i = 0; i < n; i++) {
		for (int j = i + 1; j < n; j++) {
			size_t cur = randRange(0, tot);
			if (cur < den) edges.push_back(make_pair(i, j));
		}
	}
	this -> output(n);
}